

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool any_bits_set(bitset_t *b,size_t starting_loc)

{
  size_t k;
  size_t starting_loc_local;
  bitset_t *b_local;
  
  k = starting_loc;
  if (starting_loc < b->arraysize) {
    for (; k < b->arraysize; k = k + 1) {
      if (b->array[k] != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool any_bits_set(const bitset_t *b, size_t starting_loc) {
    if (starting_loc >= b->arraysize) {
        return false;
    }
    for (size_t k = starting_loc; k < b->arraysize; k++) {
        if (b->array[k] != 0) return true;
    }
    return false;
}